

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O1

LLVMValueRef CompileLlvm(LlvmCompilationContext *ctx,ExprBase *expression)

{
  LLVMValueRef pLVar1;
  ExprBase *expression_00;
  TypeBase *type;
  
  switch(expression->typeID) {
  case 2:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
    if (expression->type == ctx->ctx->typeVoid) {
      return (LLVMValueRef)0x0;
    }
    __assert_fail("node->type == ctx.ctx.typeVoid",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                  ,0x27b,
                  "LLVMValueRef CheckType(LlvmCompilationContext &, ExprBase *, LLVMValueRef)");
  case 3:
  case 4:
    type = ctx->ctx->typeInt;
    break;
  case 5:
    pLVar1 = CompileLlvmStringLiteral(ctx,(ExprStringLiteral *)expression);
    return pLVar1;
  case 6:
    pLVar1 = CompileLlvmIntegerLiteral(ctx,(ExprIntegerLiteral *)expression);
    return pLVar1;
  case 7:
    type = ctx->ctx->typeDouble;
    break;
  case 8:
  case 9:
  case 10:
    type = expression->type;
    break;
  default:
    __assert_fail("!\"unknown type\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeLlvm.cpp"
                  ,0x8ef,"LLVMValueRef CompileLlvm(LlvmCompilationContext &, ExprBase *)");
  case 0xe:
  case 0x17:
    pLVar1 = CompileLlvm(ctx,(ExprBase *)expression[1]._vptr_ExprBase);
    goto LAB_00197ef3;
  case 0xf:
    pLVar1 = CompileLlvmArray(ctx,(ExprArray *)expression);
    return pLVar1;
  case 0x10:
    pLVar1 = CompileLlvmPreModify(ctx,(ExprPreModify *)expression);
    return pLVar1;
  case 0x11:
    pLVar1 = CompileLlvmPostModify(ctx,(ExprPostModify *)expression);
    return pLVar1;
  case 0x12:
    pLVar1 = CompileLlvmTypeCast(ctx,(ExprTypeCast *)expression);
    return pLVar1;
  case 0x13:
    pLVar1 = CompileLlvmUnaryOp(ctx,(ExprUnaryOp *)expression);
    return pLVar1;
  case 0x14:
    pLVar1 = CompileLlvmBinaryOp(ctx,(ExprBinaryOp *)expression);
    return pLVar1;
  case 0x15:
    pLVar1 = CompileLlvmGetAddress(ctx,(ExprGetAddress *)expression);
    return pLVar1;
  case 0x16:
    pLVar1 = CompileLlvmDereference(ctx,(ExprDereference *)expression);
    return pLVar1;
  case 0x18:
    pLVar1 = CompileLlvmConditional(ctx,(ExprConditional *)expression);
    return pLVar1;
  case 0x19:
    pLVar1 = CompileLlvmAssignment(ctx,(ExprAssignment *)expression);
    return pLVar1;
  case 0x1a:
    pLVar1 = CompileLlvmMemberAccess(ctx,(ExprMemberAccess *)expression);
    return pLVar1;
  case 0x1b:
    pLVar1 = CompileLlvmArrayIndex(ctx,(ExprArrayIndex *)expression);
    return pLVar1;
  case 0x1c:
    pLVar1 = CompileLlvmReturn(ctx,(ExprReturn *)expression);
    return pLVar1;
  case 0x1d:
    pLVar1 = CompileLlvmYield(ctx,(ExprYield *)expression);
    return pLVar1;
  case 0x1e:
    pLVar1 = CompileLlvmVariableDefinition(ctx,(ExprVariableDefinition *)expression);
    return pLVar1;
  case 0x1f:
    pLVar1 = CompileLlvmZeroInitialize(ctx,(ExprZeroInitialize *)expression);
    return pLVar1;
  case 0x20:
    pLVar1 = CompileLlvmArraySetup(ctx,(ExprArraySetup *)expression);
    return pLVar1;
  case 0x21:
    pLVar1 = CompileLlvmVariableDefinitions(ctx,(ExprVariableDefinitions *)expression);
    return pLVar1;
  case 0x22:
    pLVar1 = CompileLlvmVariableAccess(ctx,(ExprVariableAccess *)expression);
    return pLVar1;
  case 0x23:
    pLVar1 = CompileLlvmFunctionContextAccess(ctx,(ExprFunctionContextAccess *)expression);
    return pLVar1;
  case 0x24:
    pLVar1 = CompileLlvmFunctionDefinition(ctx,(ExprFunctionDefinition *)expression);
    return pLVar1;
  case 0x25:
    for (expression_00 = *(ExprBase **)&expression[1].typeID; expression_00 != (ExprBase *)0x0;
        expression_00 = expression_00->next) {
      CompileLlvm(ctx,expression_00);
    }
    return (LLVMValueRef)0x0;
  case 0x26:
    pLVar1 = CompileLlvmFunctionAccess(ctx,(ExprFunctionAccess *)expression);
    return pLVar1;
  case 0x29:
    pLVar1 = CompileLlvmFunctionCall(ctx,(ExprFunctionCall *)expression);
    return pLVar1;
  case 0x2f:
    pLVar1 = CompileLlvmIfElse(ctx,(ExprIfElse *)expression);
    return pLVar1;
  case 0x30:
    pLVar1 = CompileLlvmFor(ctx,(ExprFor *)expression);
    return pLVar1;
  case 0x31:
    pLVar1 = CompileLlvmWhile(ctx,(ExprWhile *)expression);
    return pLVar1;
  case 0x32:
    pLVar1 = CompileLlvmDoWhile(ctx,(ExprDoWhile *)expression);
    return pLVar1;
  case 0x33:
    pLVar1 = CompileLlvmSwitch(ctx,(ExprSwitch *)expression);
    return pLVar1;
  case 0x34:
    pLVar1 = CompileLlvmBreak(ctx,(ExprBreak *)expression);
    return pLVar1;
  case 0x35:
    pLVar1 = CompileLlvmContinue(ctx,(ExprContinue *)expression);
    return pLVar1;
  case 0x36:
    pLVar1 = CompileLlvmBlock(ctx,(ExprBlock *)expression);
    return pLVar1;
  case 0x37:
    pLVar1 = CompileLlvmSequence(ctx,(ExprSequence *)expression);
    return pLVar1;
  }
  CompileLlvmType(ctx,type);
  pLVar1 = (LLVMValueRef)&placeholderValue;
LAB_00197ef3:
  pLVar1 = CheckType(ctx,expression,pLVar1);
  return pLVar1;
}

Assistant:

LLVMValueRef CompileLlvm(LlvmCompilationContext &ctx, ExprBase *expression)
{
	switch(expression->typeID)
	{
	case ExprVoid::myTypeID:
		return CompileLlvmVoid(ctx, (ExprVoid*)expression);
	case ExprBoolLiteral::myTypeID:
		return CompileLlvmBoolLiteral(ctx, (ExprBoolLiteral*)expression);
	case ExprCharacterLiteral::myTypeID:
		return CompileLlvmCharacterLiteral(ctx, (ExprCharacterLiteral*)expression);
	case ExprStringLiteral::myTypeID:
		return CompileLlvmStringLiteral(ctx, (ExprStringLiteral*)expression);
	case ExprIntegerLiteral::myTypeID:
		return CompileLlvmIntegerLiteral(ctx, (ExprIntegerLiteral*)expression);
	case ExprRationalLiteral::myTypeID:
		return CompileLlvmRationalLiteral(ctx, (ExprRationalLiteral*)expression);
	case ExprTypeLiteral::myTypeID:
		return CompileLlvmTypeLiteral(ctx, (ExprTypeLiteral*)expression);
	case ExprNullptrLiteral::myTypeID:
		return CompileLlvmNullptrLiteral(ctx, (ExprNullptrLiteral*)expression);
	case ExprFunctionIndexLiteral::myTypeID:
		return CompileLlvmFunctionIndexLiteral(ctx, (ExprFunctionIndexLiteral*)expression);
	case ExprPassthrough::myTypeID:
		return CompileLlvmPassthrough(ctx, (ExprPassthrough*)expression);
	case ExprArray::myTypeID:
		return CompileLlvmArray(ctx, (ExprArray*)expression);
	case ExprPreModify::myTypeID:
		return CompileLlvmPreModify(ctx, (ExprPreModify*)expression);
	case ExprPostModify::myTypeID:
		return CompileLlvmPostModify(ctx, (ExprPostModify*)expression);
	case ExprTypeCast::myTypeID:
		return CompileLlvmTypeCast(ctx, (ExprTypeCast*)expression);
	case ExprUnaryOp::myTypeID:
		return CompileLlvmUnaryOp(ctx, (ExprUnaryOp*)expression);
	case ExprBinaryOp::myTypeID:
		return CompileLlvmBinaryOp(ctx, (ExprBinaryOp*)expression);
	case ExprGetAddress::myTypeID:
		return CompileLlvmGetAddress(ctx, (ExprGetAddress*)expression);
	case ExprDereference::myTypeID:
		return CompileLlvmDereference(ctx, (ExprDereference*)expression);
	case ExprUnboxing::myTypeID:
		return CompileLlvmUnboxing(ctx, (ExprUnboxing*)expression);
	case ExprConditional::myTypeID:
		return CompileLlvmConditional(ctx, (ExprConditional*)expression);
	case ExprAssignment::myTypeID:
		return CompileLlvmAssignment(ctx, (ExprAssignment*)expression);
	case ExprMemberAccess::myTypeID:
		return CompileLlvmMemberAccess(ctx, (ExprMemberAccess*)expression);
	case ExprArrayIndex::myTypeID:
		return CompileLlvmArrayIndex(ctx, (ExprArrayIndex*)expression);
	case ExprReturn::myTypeID:
		return CompileLlvmReturn(ctx, (ExprReturn*)expression);
	case ExprYield::myTypeID:
		return CompileLlvmYield(ctx, (ExprYield*)expression);
	case ExprVariableDefinition::myTypeID:
		return CompileLlvmVariableDefinition(ctx, (ExprVariableDefinition*)expression);
	case ExprZeroInitialize::myTypeID:
		return CompileLlvmZeroInitialize(ctx, (ExprZeroInitialize*)expression);
	case ExprArraySetup::myTypeID:
		return CompileLlvmArraySetup(ctx, (ExprArraySetup*)expression);
	case ExprVariableDefinitions::myTypeID:
		return CompileLlvmVariableDefinitions(ctx, (ExprVariableDefinitions*)expression);
	case ExprVariableAccess::myTypeID:
		return CompileLlvmVariableAccess(ctx, (ExprVariableAccess*)expression);
	case ExprFunctionContextAccess::myTypeID:
		return CompileLlvmFunctionContextAccess(ctx, (ExprFunctionContextAccess*)expression);
	case ExprFunctionDefinition::myTypeID:
		return CompileLlvmFunctionDefinition(ctx, (ExprFunctionDefinition*)expression);
	case ExprGenericFunctionPrototype::myTypeID:
		return CompileLlvmGenericFunctionPrototype(ctx, (ExprGenericFunctionPrototype*)expression);
	case ExprFunctionAccess::myTypeID:
		return CompileLlvmFunctionAccess(ctx, (ExprFunctionAccess*)expression);
	case ExprFunctionCall::myTypeID:
		return CompileLlvmFunctionCall(ctx, (ExprFunctionCall*)expression);
	case ExprAliasDefinition::myTypeID:
		return CompileLlvmAliasDefinition(ctx, (ExprAliasDefinition*)expression);
	case ExprClassPrototype::myTypeID:
		return CompileLlvmClassPrototype(ctx, (ExprClassPrototype*)expression);
	case ExprGenericClassPrototype::myTypeID:
		return CompileLlvmGenericClassPrototype(ctx, (ExprGenericClassPrototype*)expression);
	case ExprClassDefinition::myTypeID:
		return CompileLlvmClassDefinition(ctx, (ExprClassDefinition*)expression);
	case ExprEnumDefinition::myTypeID:
		return CompileLlvmEnumDefinition(ctx, (ExprEnumDefinition*)expression);
	case ExprIfElse::myTypeID:
		return CompileLlvmIfElse(ctx, (ExprIfElse*)expression);
	case ExprFor::myTypeID:
		return CompileLlvmFor(ctx, (ExprFor*)expression);
	case ExprWhile::myTypeID:
		return CompileLlvmWhile(ctx, (ExprWhile*)expression);
	case ExprDoWhile::myTypeID:
		return CompileLlvmDoWhile(ctx, (ExprDoWhile*)expression);
	case ExprSwitch::myTypeID:
		return CompileLlvmSwitch(ctx, (ExprSwitch*)expression);
	case ExprBreak::myTypeID:
		return CompileLlvmBreak(ctx, (ExprBreak*)expression);
	case ExprContinue::myTypeID:
		return CompileLlvmContinue(ctx, (ExprContinue*)expression);
	case ExprBlock::myTypeID:
		return CompileLlvmBlock(ctx, (ExprBlock*)expression);
	case ExprSequence::myTypeID:
		return CompileLlvmSequence(ctx, (ExprSequence*)expression);
	}

	assert(!"unknown type");

	return NULL;
}